

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

ObjectSplit * __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_object_find
          (ObjectSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize,SplitInfo *info)

{
  BBox3fa *pBVar1;
  int *piVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  PrimRef *pPVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  uint uVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar23;
  uint *puVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar27;
  ulong uVar28;
  long lVar29;
  float fVar30;
  uint uVar34;
  uint uVar35;
  float fVar36;
  undefined1 auVar32 [16];
  uint uVar31;
  undefined1 auVar33 [16];
  uint uVar37;
  uint uVar39;
  float fVar40;
  uint uVar41;
  uint uVar42;
  float fVar43;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar49;
  uint uVar50;
  uint uVar52;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar51;
  uint uVar54;
  uint uVar55;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar53;
  uint uVar56;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  ObjectBinner binner;
  vuint4 rCounts [32];
  vfloat4 rAreas [32];
  ulong local_1310;
  uint local_12d0 [4];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_12c0;
  float local_1290 [3];
  uint uStack_1284;
  undefined8 local_1280 [2];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1230 [186];
  int aiStack_690 [4];
  undefined8 local_680;
  int aiStack_678 [122];
  int aiStack_490 [8];
  int aiStack_470 [120];
  undefined8 uStack_290;
  float afStack_288 [6];
  float afStack_270 [144];
  
  lVar15 = 0xc00;
  paVar23 = local_1230;
  do {
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)paVar23[-1].m128 = _DAT_01f7a9f0;
    *paVar23 = _DAT_01f7aa00;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)paVar23[-3].m128 = _DAT_01f7a9f0;
    paVar23[-2] = _DAT_01f7aa00;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)paVar23[-5].m128 = _DAT_01f7a9f0;
    paVar23[-4] = _DAT_01f7aa00;
    *(undefined8 *)((long)local_1280 + lVar15) = 0;
    *(undefined8 *)((long)local_1280 + lVar15 + 8) = 0;
    lVar15 = lVar15 + 0x10;
    paVar23 = paVar23 + 6;
  } while (lVar15 != 0xe00);
  uVar7 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  uVar8 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  fVar30 = (float)(uVar7 - uVar8) * 0.05 + 4.0;
  uVar16 = (ulong)fVar30;
  uVar16 = (long)(fVar30 - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16;
  uVar25 = 0x20;
  if (uVar16 < 0x20) {
    uVar25 = uVar16;
  }
  pBVar1 = &(set->super_CentGeomBBox3fa).centBounds;
  fVar30 = (pBVar1->lower).field_0.m128[0];
  fVar36 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[1];
  uVar13 = *(undefined8 *)&(pBVar1->lower).field_0;
  pfVar12 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128 + 2;
  fVar40 = *pfVar12;
  uVar14 = *(undefined8 *)pfVar12;
  auVar32._0_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[0] - fVar30;
  auVar32._4_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[1] - fVar36;
  auVar32._8_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[2] - fVar40;
  auVar32._12_4_ =
       (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[3] -
       (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[3];
  auVar61 = maxps(_DAT_01f7bb10,auVar32);
  auVar33._0_4_ = (float)(long)uVar25 * 0.99;
  auVar33._4_4_ = auVar33._0_4_;
  auVar33._8_4_ = auVar33._0_4_;
  auVar33._12_4_ = auVar33._0_4_;
  auVar32 = divps(auVar33,auVar61);
  local_1290[0] = (float)(-(uint)((float)DAT_01f7bb10 < auVar61._0_4_) & auVar32._0_4_);
  local_1290[1] = (float)(-(uint)(DAT_01f7bb10._4_4_ < auVar61._4_4_) & auVar32._4_4_);
  local_1290[2] = (float)(-(uint)(DAT_01f7bb10._8_4_ < auVar61._8_4_) & auVar32._8_4_);
  uStack_1284 = -(uint)(DAT_01f7bb10._12_4_ < auVar61._12_4_) & auVar32._12_4_;
  uVar21 = uVar7 - uVar8;
  if (uVar21 != 0) {
    pPVar9 = this->prims0;
    if (uVar21 == 1) {
      uVar22 = 0;
    }
    else {
      uVar19 = (int)uVar25 - 1;
      paVar27 = &pPVar9[uVar8 + 1].upper.field_0;
      uVar22 = 0;
      do {
        aVar3 = paVar27[-3].field_1;
        aVar4 = paVar27[-2].field_1;
        uVar31 = (uint)(((aVar3.x + aVar4.x) - fVar30) * local_1290[0] + -0.5);
        uVar34 = (uint)(((aVar3.y + aVar4.y) - fVar36) * local_1290[1] + -0.5);
        uVar35 = (uint)(((aVar3.z + aVar4.z) - fVar40) * local_1290[2] + -0.5);
        uVar37 = -(uint)((int)uVar19 < (int)uVar31);
        uVar39 = -(uint)((int)uVar19 < (int)uVar34);
        uVar41 = -(uint)((int)uVar19 < (int)uVar35);
        aVar5 = paVar27[-1].field_1;
        uVar37 = ~uVar37 & uVar31 | uVar19 & uVar37;
        uVar52 = ~uVar39 & uVar34 | uVar19 & uVar39;
        uVar50 = ~uVar41 & uVar35 | uVar19 & uVar41;
        aVar6 = paVar27->field_1;
        uVar31 = (uint)(((aVar5.x + aVar6.x) - fVar30) * local_1290[0] + -0.5);
        uVar34 = (uint)(((aVar5.y + aVar6.y) - fVar36) * local_1290[1] + -0.5);
        uVar35 = (uint)(((aVar5.z + aVar6.z) - fVar40) * local_1290[2] + -0.5);
        uVar39 = -(uint)((int)uVar19 < (int)uVar31);
        uVar41 = -(uint)((int)uVar19 < (int)uVar34);
        uVar42 = -(uint)((int)uVar19 < (int)uVar35);
        uVar31 = ~uVar39 & uVar31 | uVar19 & uVar39;
        uVar34 = ~uVar41 & uVar34 | uVar19 & uVar41;
        uVar35 = ~uVar42 & uVar35 | uVar19 & uVar42;
        uVar28 = (ulong)(-(uint)(0 < (int)uVar37) & uVar37);
        auVar32 = *(undefined1 (*) [16])(local_1270 + uVar28 * 0x60);
        auVar33 = minps(*(undefined1 (*) [16])(local_1280 + uVar28 * 0xc),(undefined1  [16])aVar3);
        *(undefined1 (*) [16])(local_1280 + uVar28 * 0xc) = auVar33;
        auVar32 = maxps(auVar32,(undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_1270 + uVar28 * 0x60) = auVar32;
        uVar10 = (ulong)(-(uint)(0 < (int)uVar52) & uVar52);
        lVar15 = uVar10 * 0x60;
        auVar32 = minps(*(undefined1 (*) [16])(local_1260 + lVar15),(undefined1  [16])aVar3);
        auVar33 = maxps(*(undefined1 (*) [16])(local_1250 + lVar15),(undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_1260 + lVar15) = auVar32;
        uVar11 = (ulong)(-(uint)(0 < (int)uVar50) & uVar50);
        *(undefined1 (*) [16])(local_1250 + lVar15) = auVar33;
        aVar38 = local_1230[uVar11 * 6];
        auVar32 = minps(*(undefined1 (*) [16])(local_1240 + uVar11 * 0x60),(undefined1  [16])aVar3);
        *(undefined1 (*) [16])(local_1240 + uVar11 * 0x60) = auVar32;
        aVar38.m128 = (__m128)maxps(aVar38.m128,(undefined1  [16])aVar4);
        local_1230[uVar11 * 6] = aVar38;
        *(int *)(&local_680 + uVar28 * 2) = *(int *)(&local_680 + uVar28 * 2) + 1;
        piVar2 = (int *)((long)&local_680 + uVar10 * 0x10 + 4);
        *piVar2 = *piVar2 + 1;
        uVar28 = (ulong)(-(uint)(0 < (int)uVar31) & uVar31);
        aiStack_678[uVar11 * 4] = aiStack_678[uVar11 * 4] + 1;
        auVar32 = minps(*(undefined1 (*) [16])(local_1280 + uVar28 * 0xc),(undefined1  [16])aVar5);
        auVar33 = maxps(*(undefined1 (*) [16])(local_1270 + uVar28 * 0x60),(undefined1  [16])aVar6);
        *(undefined1 (*) [16])(local_1280 + uVar28 * 0xc) = auVar32;
        uVar10 = (ulong)(-(uint)(0 < (int)uVar34) & uVar34);
        lVar15 = uVar10 * 0x60;
        *(undefined1 (*) [16])(local_1270 + uVar28 * 0x60) = auVar33;
        auVar32 = minps(*(undefined1 (*) [16])(local_1260 + lVar15),(undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_1260 + lVar15) = auVar32;
        auVar32 = maxps(*(undefined1 (*) [16])(local_1250 + lVar15),(undefined1  [16])aVar6);
        uVar11 = (ulong)(-(uint)(0 < (int)uVar35) & uVar35);
        *(undefined1 (*) [16])(local_1250 + lVar15) = auVar32;
        aVar38 = local_1230[uVar11 * 6];
        auVar32 = minps(*(undefined1 (*) [16])(local_1240 + uVar11 * 0x60),(undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_1240 + uVar11 * 0x60) = auVar32;
        aVar38.m128 = (__m128)maxps(aVar38.m128,(undefined1  [16])aVar6);
        local_1230[uVar11 * 6] = aVar38;
        *(int *)(&local_680 + uVar28 * 2) = *(int *)(&local_680 + uVar28 * 2) + 1;
        piVar2 = (int *)((long)&local_680 + uVar10 * 0x10 + 4);
        *piVar2 = *piVar2 + 1;
        aiStack_678[uVar11 * 4] = aiStack_678[uVar11 * 4] + 1;
        uVar22 = uVar22 + 2;
        paVar27 = paVar27 + 4;
      } while (uVar22 < uVar21 - 1);
    }
    if (uVar22 < uVar21) {
      aVar3 = pPVar9[uVar8 + uVar22].lower.field_0.field_1;
      aVar4 = pPVar9[uVar8 + uVar22].upper.field_0.field_1;
      uVar31 = (uint)(((aVar3.x + aVar4.x) - fVar30) * local_1290[0] + -0.5);
      uVar34 = (uint)(((aVar3.y + aVar4.y) - fVar36) * local_1290[1] + -0.5);
      uVar35 = (uint)(((aVar3.z + aVar4.z) - fVar40) * local_1290[2] + -0.5);
      uVar19 = (int)uVar25 - 1;
      uVar37 = -(uint)((int)uVar19 < (int)uVar31);
      uVar39 = -(uint)((int)uVar19 < (int)uVar34);
      uVar52 = -(uint)((int)uVar19 < (int)uVar35);
      uVar31 = ~uVar37 & uVar31 | uVar19 & uVar37;
      uVar34 = ~uVar39 & uVar34 | uVar19 & uVar39;
      uVar19 = ~uVar52 & uVar35 | uVar19 & uVar52;
      uVar21 = (ulong)(-(uint)(0 < (int)uVar31) & uVar31);
      *(int *)(&local_680 + uVar21 * 2) = *(int *)(&local_680 + uVar21 * 2) + 1;
      auVar32 = *(undefined1 (*) [16])(local_1270 + uVar21 * 0x60);
      auVar33 = minps(*(undefined1 (*) [16])(local_1280 + uVar21 * 0xc),(undefined1  [16])aVar3);
      *(undefined1 (*) [16])(local_1280 + uVar21 * 0xc) = auVar33;
      auVar32 = maxps(auVar32,(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1270 + uVar21 * 0x60) = auVar32;
      uVar21 = (ulong)(-(uint)(0 < (int)uVar34) & uVar34);
      piVar2 = (int *)((long)&local_680 + uVar21 * 0x10 + 4);
      *piVar2 = *piVar2 + 1;
      lVar15 = uVar21 * 0x60;
      auVar32 = minps(*(undefined1 (*) [16])(local_1260 + lVar15),(undefined1  [16])aVar3);
      *(undefined1 (*) [16])(local_1260 + lVar15) = auVar32;
      auVar32 = maxps(*(undefined1 (*) [16])(local_1250 + lVar15),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1250 + lVar15) = auVar32;
      uVar21 = (ulong)(-(uint)(0 < (int)uVar19) & uVar19);
      aiStack_678[uVar21 * 4] = aiStack_678[uVar21 * 4] + 1;
      aVar38 = local_1230[uVar21 * 6];
      auVar32 = minps(*(undefined1 (*) [16])(local_1240 + uVar21 * 0x60),(undefined1  [16])aVar3);
      *(undefined1 (*) [16])(local_1240 + uVar21 * 0x60) = auVar32;
      aVar38.m128 = (__m128)maxps(aVar38.m128,(undefined1  [16])aVar4);
      local_1230[uVar21 * 6] = aVar38;
    }
  }
  lVar15 = uVar25 - 1;
  if (lVar15 != 0) {
    lVar17 = uVar25 * 0x10;
    pauVar26 = (undefined1 (*) [16])(local_1290 + uVar25 * 0x18);
    iVar45 = 0;
    iVar46 = 0;
    iVar47 = 0;
    iVar48 = 0;
    lVar29 = 0;
    aVar38 = _DAT_01f7a9f0;
    aVar44 = _DAT_01f7aa00;
    aVar49 = _DAT_01f7aa00;
    aVar51 = _DAT_01f7a9f0;
    aVar53 = _DAT_01f7aa00;
    aVar57 = _DAT_01f7a9f0;
    do {
      piVar2 = (int *)((long)aiStack_690 + lVar29 + lVar17);
      iVar45 = iVar45 + *piVar2;
      iVar46 = iVar46 + piVar2[1];
      iVar47 = iVar47 + piVar2[2];
      iVar48 = iVar48 + piVar2[3];
      piVar2 = (int *)((long)aiStack_490 + lVar29 + lVar17);
      *piVar2 = iVar45;
      piVar2[1] = iVar46;
      piVar2[2] = iVar47;
      piVar2[3] = iVar48;
      aVar38.m128 = (__m128)minps(aVar38.m128,pauVar26[-5]);
      aVar44.m128 = (__m128)maxps(aVar44.m128,pauVar26[-4]);
      fVar30 = aVar44.m128[1] - aVar38.m128[1];
      fVar36 = aVar44.m128[2] - aVar38.m128[2];
      aVar51.m128 = (__m128)minps(aVar51.m128,pauVar26[-3]);
      aVar49.m128 = (__m128)maxps(aVar49.m128,pauVar26[-2]);
      fVar40 = aVar49.m128[1] - aVar51.m128[1];
      fVar43 = aVar49.m128[2] - aVar51.m128[2];
      *(ulong *)((long)&uStack_290 + lVar29 + lVar17) =
           CONCAT44((aVar49.m128[0] - aVar51.m128[0]) * (fVar40 + fVar43) + fVar43 * fVar40,
                    (aVar44.m128[0] - aVar38.m128[0]) * (fVar30 + fVar36) + fVar36 * fVar30);
      aVar57.m128 = (__m128)minps(aVar57.m128,pauVar26[-1]);
      aVar53.m128 = (__m128)maxps(aVar53.m128,*pauVar26);
      fVar30 = aVar53.m128[1] - aVar57.m128[1];
      fVar36 = aVar53.m128[2] - aVar57.m128[2];
      *(float *)((long)afStack_288 + lVar29 + lVar17) =
           (fVar30 + fVar36) * (aVar53.m128[0] - aVar57.m128[0]) + fVar36 * fVar30;
      *(undefined4 *)((long)afStack_288 + lVar29 + lVar17 + 4) = 0;
      lVar29 = lVar29 + -0x10;
      pauVar26 = pauVar26 + -6;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  uVar21 = 0xffffffff;
  local_12c0 = _DAT_01f7a9f0;
  if (uVar16 < 2) {
    local_12d0[0] = 0;
    local_12d0[1] = 0;
    local_12d0[2] = 0;
    local_12d0[3] = 0;
  }
  else {
    uVar37 = ~(-1 << ((byte)logBlockSize & 0x1f));
    paVar23 = local_1230;
    uVar19 = 1;
    uVar31 = 1;
    uVar34 = 1;
    uVar35 = 1;
    iVar45 = 0;
    iVar46 = 0;
    iVar47 = 0;
    iVar48 = 0;
    lVar15 = 0;
    local_12d0[0] = 0;
    local_12d0[1] = 0;
    local_12d0[2] = 0;
    local_12d0[3] = 0;
    aVar38 = _DAT_01f7aa00;
    aVar44 = _DAT_01f7aa00;
    aVar49 = _DAT_01f7a9f0;
    aVar51 = _DAT_01f7aa00;
    aVar53 = _DAT_01f7a9f0;
    aVar57 = _DAT_01f7a9f0;
    do {
      aVar49.m128 = (__m128)minps(aVar49.m128,paVar23[-5]);
      aVar44.m128 = (__m128)maxps(aVar44.m128,paVar23[-4]);
      aVar53.m128 = (__m128)minps(aVar53.m128,paVar23[-3]);
      aVar51.m128 = (__m128)maxps(aVar51.m128,paVar23[-2]);
      fVar40 = aVar44.m128[1] - aVar49.m128[1];
      fVar43 = aVar44.m128[2] - aVar49.m128[2];
      aVar57.m128 = (__m128)minps(aVar57.m128,paVar23[-1]);
      fVar30 = aVar51.m128[1] - aVar53.m128[1];
      fVar36 = aVar51.m128[2] - aVar53.m128[2];
      aVar38.m128 = (__m128)maxps(aVar38.m128,*paVar23);
      fVar58 = aVar38.m128[0] - aVar57.m128[0];
      fVar59 = aVar38.m128[1] - aVar57.m128[1];
      fVar60 = aVar38.m128[2] - aVar57.m128[2];
      iVar45 = iVar45 + *(int *)((long)&local_680 + lVar15);
      iVar46 = iVar46 + *(int *)((long)&local_680 + lVar15 + 4);
      iVar47 = iVar47 + *(int *)((long)aiStack_678 + lVar15);
      iVar48 = iVar48 + *(int *)((long)aiStack_678 + lVar15 + 4);
      local_1310 = logBlockSize & 0xffffffff;
      uVar39 = iVar45 + uVar37 >> local_1310;
      uVar52 = iVar46 + uVar37 >> local_1310;
      uVar41 = iVar47 + uVar37 >> local_1310;
      uVar50 = iVar48 + uVar37 >> local_1310;
      uVar42 = *(int *)((long)aiStack_470 + lVar15) + uVar37 >> local_1310;
      uVar54 = *(int *)((long)aiStack_470 + lVar15 + 4) + uVar37 >> local_1310;
      uVar55 = *(int *)((long)aiStack_470 + lVar15 + 8) + uVar37 >> local_1310;
      uVar56 = *(int *)((long)aiStack_470 + lVar15 + 0xc) + uVar37 >> local_1310;
      auVar61._0_4_ =
           ((float)(uVar42 & 0x7fffffff) + (float)((int)uVar42 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_270 + lVar15) +
           ((float)(uVar39 & 0x7fffffff) + (float)((int)uVar39 >> 0x1f & 0x4f000000)) *
           ((aVar44.m128[0] - aVar49.m128[0]) * (fVar40 + fVar43) + fVar43 * fVar40);
      auVar61._4_4_ =
           ((float)(uVar54 & 0x7fffffff) + (float)((int)uVar54 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_270 + lVar15 + 4) +
           ((float)(uVar52 & 0x7fffffff) + (float)((int)uVar52 >> 0x1f & 0x4f000000)) *
           ((aVar51.m128[0] - aVar53.m128[0]) * (fVar30 + fVar36) + fVar36 * fVar30);
      auVar61._8_4_ =
           ((float)(uVar55 & 0x7fffffff) + (float)((int)uVar55 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_270 + lVar15 + 8) +
           ((float)(uVar41 & 0x7fffffff) + (float)((int)uVar41 >> 0x1f & 0x4f000000)) *
           (fVar58 * (fVar60 + fVar59) + fVar59 * fVar60);
      auVar61._12_4_ =
           ((float)(uVar56 & 0x7fffffff) + (float)((int)uVar56 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_270 + lVar15 + 0xc) +
           ((float)(uVar50 & 0x7fffffff) + (float)((int)uVar50 >> 0x1f & 0x4f000000)) *
           (fVar58 * (fVar59 + fVar60) + fVar60 * fVar59);
      uVar39 = -(uint)(local_12c0.m128[0] <= auVar61._0_4_);
      uVar52 = -(uint)(local_12c0.m128[1] <= auVar61._4_4_);
      uVar41 = -(uint)(local_12c0.m128[2] <= auVar61._8_4_);
      uVar50 = -(uint)(local_12c0.m128[3] <= auVar61._12_4_);
      local_12d0[0] = ~uVar39 & uVar19 | local_12d0[0] & uVar39;
      local_12d0[1] = ~uVar52 & uVar31 | local_12d0[1] & uVar52;
      local_12d0[2] = ~uVar41 & uVar34 | local_12d0[2] & uVar41;
      local_12d0[3] = ~uVar50 & uVar35 | local_12d0[3] & uVar50;
      local_12c0.m128 = (__m128)minps(auVar61,local_12c0.m128);
      uVar19 = uVar19 + 1;
      uVar31 = uVar31 + 1;
      uVar34 = uVar34 + 1;
      uVar35 = uVar35 + 1;
      paVar23 = paVar23 + 6;
      lVar15 = lVar15 + 0x10;
    } while (uVar25 * 0x10 + -0x10 != lVar15);
  }
  fVar30 = INFINITY;
  uVar16 = 0;
  uVar19 = 0;
  do {
    if ((((local_1290[uVar16] != 0.0) || (NAN(local_1290[uVar16]))) &&
        (local_1290[uVar16 - 0xc] < fVar30)) && (local_12d0[uVar16] != 0)) {
      uVar21 = uVar16 & 0xffffffff;
      uVar19 = local_12d0[uVar16];
      fVar30 = local_1290[uVar16 - 0xc];
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 != 3);
  __return_storage_ptr__->sah = fVar30;
  iVar45 = (int)uVar21;
  __return_storage_ptr__->dim = iVar45;
  (__return_storage_ptr__->field_2).pos = uVar19;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = uVar25;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = uVar13;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uVar14;
  *(ulong *)&(__return_storage_ptr__->mapping).scale.field_0 = CONCAT44(local_1290[1],local_1290[0])
  ;
  *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) =
       CONCAT44(uStack_1284,local_1290[2]);
  if (iVar45 == -1) {
    info->leftCount = 0;
    info->rightCount = 0;
    aVar38 = _DAT_01f7a9f0;
    (info->leftBounds).lower.field_0 = _DAT_01f7a9f0;
    aVar44 = _DAT_01f7aa00;
    aVar49 = _DAT_01f7aa00;
  }
  else {
    uVar16 = (ulong)(int)uVar19;
    lVar15 = (long)iVar45;
    aVar49 = _DAT_01f7aa00;
    aVar51 = _DAT_01f7a9f0;
    if (uVar19 == 0) {
      sVar18 = 0;
    }
    else {
      puVar24 = (uint *)((long)&local_680 + lVar15 * 4);
      pauVar26 = (undefined1 (*) [16])(local_1270 + lVar15 * 0x20);
      sVar18 = 0;
      uVar21 = uVar16;
      do {
        aVar51.m128 = (__m128)minps(aVar51.m128,pauVar26[-1]);
        aVar49.m128 = (__m128)maxps(aVar49.m128,*pauVar26);
        sVar18 = sVar18 + *puVar24;
        puVar24 = puVar24 + 4;
        pauVar26 = pauVar26 + 6;
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
    }
    lVar17 = uVar25 - uVar16;
    aVar38 = _DAT_01f7a9f0;
    aVar44 = _DAT_01f7aa00;
    if (uVar25 < uVar16 || lVar17 == 0) {
      sVar20 = 0;
    }
    else {
      puVar24 = (uint *)((long)&local_680 + uVar16 * 0x10 + lVar15 * 4);
      pauVar26 = (undefined1 (*) [16])(local_1270 + lVar15 * 0x20 + uVar16 * 0x60);
      sVar20 = 0;
      do {
        aVar38.m128 = (__m128)minps(aVar38.m128,pauVar26[-1]);
        aVar44.m128 = (__m128)maxps(aVar44.m128,*pauVar26);
        sVar20 = sVar20 + *puVar24;
        puVar24 = puVar24 + 4;
        pauVar26 = pauVar26 + 6;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    info->leftCount = sVar18;
    info->rightCount = sVar20;
    (info->leftBounds).lower.field_0 = aVar51;
  }
  (info->leftBounds).upper.field_0 = aVar49;
  (info->rightBounds).lower.field_0 = aVar38;
  (info->rightBounds).upper.field_0 = aVar44;
  return __return_storage_ptr__;
}

Assistant:

sequential_object_find(const PrimInfoExtRange& set, const size_t logBlockSize, SplitInfo &info)
        {
          ObjectBinner binner(empty); 
          const BinMapping<OBJECT_BINS> mapping(set);
          binner.bin(prims0,set.begin(),set.end(),mapping);
          ObjectSplit s = binner.best(mapping,logBlockSize);
          binner.getSplitInfo(mapping, s, info);
          return s;
        }